

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

void __thiscall
groundupdbext::FileKeyValueStore::loadKeysInto
          (FileKeyValueStore *this,
          function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)> *callback)

{
  size_type sVar1;
  bool bVar2;
  path *this_00;
  void *pvVar3;
  unsigned_long i;
  size_type sVar4;
  directory_iterator local_588;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_558;
  string data;
  string hashWithExtension;
  string type;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string strhash;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_498;
  size_t hash;
  path fp;
  string eol;
  HashedKey key;
  EncodedValue local_400;
  ifstream t;
  stringstream sstream;
  
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  eol._M_dataplus._M_p = (pointer)&eol.field_2;
  eol._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  data.field_2._M_local_buf[0] = '\0';
  eol.field_2._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&fp,&((this->mImpl)._M_t.
                   super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                  _M_head_impl)->m_fullpath,auto_format);
  Catch::clara::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_558,(path *)&fp);
  Catch::clara::std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_4e8,&local_558);
  local_588._M_dir._M_ptr = (element_type *)local_4e8._M_ptr;
  local_588._M_dir._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._M_refcount._M_pi;
  local_4e8._M_ptr = (element_type *)0x0;
  local_4e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8._M_refcount);
  Catch::clara::std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_498,&local_558);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498._M_refcount);
  while (local_588._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    this_00 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_588);
    bVar2 = std::filesystem::__cxx11::directory_entry::exists((directory_entry *)this_00);
    if (bVar2) {
      bVar2 = std::filesystem::__cxx11::directory_entry::is_regular_file((directory_entry *)this_00)
      ;
      if (bVar2) {
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  ((path *)&t,(char (*) [5])".key",auto_format);
        std::filesystem::__cxx11::path::extension((path *)&sstream,this_00);
        bVar2 = std::filesystem::__cxx11::operator==((path *)&t,(path *)&sstream);
        Catch::clara::std::filesystem::__cxx11::path::~path((path *)&sstream);
        Catch::clara::std::filesystem::__cxx11::path::~path((path *)&t);
        if (bVar2) {
          std::filesystem::__cxx11::path::filename((path *)&t,this_00);
          std::filesystem::__cxx11::path::string(&hashWithExtension,(path *)&t);
          Catch::clara::std::filesystem::__cxx11::path::~path((path *)&t);
          std::__cxx11::string::substr((ulong)&strhash,(ulong)&hashWithExtension);
          std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                    ((ifstream *)&t,this_00,_S_in);
          std::operator>>((istream *)&t,(string *)&type);
          std::operator>>((istream *)&t,(string *)&data);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&sstream,(string *)&strhash,_S_out|_S_in);
          std::istream::_M_extract<unsigned_long>((ulong *)&sstream);
          sVar1 = data._M_string_length;
          pvVar3 = operator_new__(data._M_string_length);
          for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
            *(char *)((long)pvVar3 + sVar4) = data._M_dataplus._M_p[sVar4];
          }
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4d8,pvVar3,(long)pvVar3 + sVar1);
          groundupdb::HashedValue::HashedValue<std::__cxx11::string>(&key,&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          bVar2 = std::operator==("set",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&type);
          if (!bVar2) {
            (*(this->super_KeyValueStore).super_Store._vptr_Store[3])(&local_400,this,&key);
            std::function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)>::
            operator()(callback,&key,&local_400);
            groundupdb::HashedValue::~HashedValue(&local_400.m_value);
          }
          groundupdb::HashedValue::~HashedValue(&key);
          std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
          std::ifstream::~ifstream((path *)&t);
          std::__cxx11::string::~string((string *)&strhash);
          std::__cxx11::string::~string((string *)&hashWithExtension);
        }
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_588);
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1._M_dir._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_588._M_dir._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558._M_refcount);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&fp);
  std::__cxx11::string::~string((string *)&eol);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void
FileKeyValueStore::loadKeysInto(
    std::function<void(const HashedValue& key,EncodedValue value)> callback)
{
  std::string type;
  std::string data;
  std::string eol; // eol can be multiple characters
  std::size_t hash;
  // load any files with .kv in their name
  fs::path fp(mImpl->m_fullpath);
  for (auto& p : fs::directory_iterator(fp)) {
    if (p.exists() && p.is_regular_file()) {
      // check if extension is .kv
      if(".key" == p.path().extension()) {
        // If so, open file

        std::string hashWithExtension = p.path().filename().string();
        // ASSUMPTION always ends with .kv
        std::string strhash = hashWithExtension.substr(0,hashWithExtension.length() - 4); // BUG0000001
        // TODO check that file name is long enough
        // TODO check that file exists before opening

        std::ifstream t(p.path());
        t >> type;
        t >> data;
        // Construct hashed key
        std::stringstream sstream(strhash);
        sstream >> hash;
        char* cdata = new char[data.length()];
        const char* cstr = data.c_str();
        for (unsigned long i = 0;i < data.length();i++) {
          cdata[i] = cstr[i];
        }
        HashedKey key(std::string(cdata,data.length()));
        if ("set" == type) {
          // TODO support set as an encoded value
          //callback(key,getKeyValueSet(key));
        } else {
          callback(key,getKeyValue(key));
        }
      }
    }
  }
}